

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

uint32_t lyht_get_fixed_size(uint32_t item_count)

{
  uint uVar1;
  undefined4 local_c;
  uint32_t item_count_local;
  
  if (item_count == 0) {
    local_c = 1;
  }
  else {
    uVar1 = item_count - 1 >> 1 | item_count - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    local_c = (uVar1 >> 0x10 | uVar1) + 1;
  }
  return local_c;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyht_get_fixed_size(uint32_t item_count)
{
    if (item_count == 0) {
        return 1;
    }

    /* return next power of 2 (greater or equal) */
    item_count--;
    item_count |= item_count >> 1;
    item_count |= item_count >> 2;
    item_count |= item_count >> 4;
    item_count |= item_count >> 8;
    item_count |= item_count >> 16;

    return item_count + 1;
}